

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n2builder.cpp
# Opt level: O2

void __thiscall
icu_63::Normalizer2DataBuilder::setHangulData
          (Normalizer2DataBuilder *this,UMutableCPTrie *norm16Trie)

{
  long lVar1;
  UErrorCode *pErrorCode;
  int iVar2;
  uint32_t uVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  IcuToolErrorCode errorCode;
  
  lVar4 = 0;
  do {
    if (lVar4 == 4) {
      pErrorCode = &errorCode.super_ErrorCode.errorCode;
      errorCode.super_ErrorCode.errorCode = U_ZERO_ERROR;
      errorCode.super_ErrorCode._vptr_ErrorCode = (_func_int **)&PTR__IcuToolErrorCode_0039ffb8;
      errorCode.location = "gennorm2/setHangulData()";
      if (0x1161 < this->indexes[9]) {
        this->indexes[9] = 0x1161;
      }
      umutablecptrie_setRange_63(norm16Trie,0x1100,0x1112,2,pErrorCode);
      umutablecptrie_setRange_63(norm16Trie,0x1161,0x1175,0xfe00,pErrorCode);
      umutablecptrie_setRange_63(norm16Trie,0x11a8,0x11c2,0xfe00,pErrorCode);
      uVar3 = this->indexes[10];
      if (0xac00 < this->indexes[8]) {
        this->indexes[8] = 0xac00;
      }
      uVar6 = this->indexes[0xe];
      umutablecptrie_set_63(norm16Trie,0xac00,uVar3,pErrorCode);
      umutablecptrie_setRange_63(norm16Trie,0xac01,0xd7a3,uVar6 | 1,pErrorCode);
      uVar6 = 0xac00;
      while (uVar6 < 0xd788) {
        uVar6 = uVar6 + 0x1c;
        umutablecptrie_set_63(norm16Trie,uVar6,uVar3,pErrorCode);
      }
      ErrorCode::assertSuccess(&errorCode.super_ErrorCode);
      IcuToolErrorCode::~IcuToolErrorCode(&errorCode);
      return;
    }
    lVar1 = lVar4 + 1;
    iVar2 = (&DAT_002dd864)[lVar4 * 2];
    for (lVar5 = (long)(int)(&HangulIterator::ranges)[lVar4 * 2]; lVar4 = lVar1,
        (UChar32)lVar5 <= iVar2; lVar5 = lVar5 + 1) {
      uVar3 = umutablecptrie_get_63(norm16Trie,(UChar32)lVar5);
      if (1 < uVar3) {
        fprintf(_stderr,
                "gennorm2 error: illegal mapping/composition/ccc data for Hangul or Jamo U+%04lX\n",
                lVar5);
        exit(3);
      }
    }
  } while( true );
}

Assistant:

void Normalizer2DataBuilder::setHangulData(UMutableCPTrie *norm16Trie) {
    HangulIterator hi;
    const HangulIterator::Range *range;
    // Check that none of the Hangul/Jamo code points have data.
    while((range=hi.nextRange())!=NULL) {
        for(UChar32 c=range->start; c<=range->end; ++c) {
            if(umutablecptrie_get(norm16Trie, c)>Normalizer2Impl::INERT) {
                fprintf(stderr,
                        "gennorm2 error: "
                        "illegal mapping/composition/ccc data for Hangul or Jamo U+%04lX\n",
                        (long)c);
                exit(U_INVALID_FORMAT_ERROR);
            }
        }
    }
    // Set data for algorithmic runtime handling.
    IcuToolErrorCode errorCode("gennorm2/setHangulData()");

    // Jamo V/T are maybeYes
    if(Hangul::JAMO_V_BASE<indexes[Normalizer2Impl::IX_MIN_COMP_NO_MAYBE_CP]) {
        indexes[Normalizer2Impl::IX_MIN_COMP_NO_MAYBE_CP]=Hangul::JAMO_V_BASE;
    }
    umutablecptrie_setRange(norm16Trie, Hangul::JAMO_L_BASE, Hangul::JAMO_L_END,
                            Normalizer2Impl::JAMO_L, errorCode);
    umutablecptrie_setRange(norm16Trie, Hangul::JAMO_V_BASE, Hangul::JAMO_V_END,
                            Normalizer2Impl::JAMO_VT, errorCode);
    // JAMO_T_BASE+1: not U+11A7
    umutablecptrie_setRange(norm16Trie, Hangul::JAMO_T_BASE+1, Hangul::JAMO_T_END,
                            Normalizer2Impl::JAMO_VT, errorCode);

    // Hangul LV encoded as minYesNo
    uint32_t lv=indexes[Normalizer2Impl::IX_MIN_YES_NO];
    // Hangul LVT encoded as minYesNoMappingsOnly|HAS_COMP_BOUNDARY_AFTER
    uint32_t lvt=indexes[Normalizer2Impl::IX_MIN_YES_NO_MAPPINGS_ONLY]|
        Normalizer2Impl::HAS_COMP_BOUNDARY_AFTER;
    if(Hangul::HANGUL_BASE<indexes[Normalizer2Impl::IX_MIN_DECOMP_NO_CP]) {
        indexes[Normalizer2Impl::IX_MIN_DECOMP_NO_CP]=Hangul::HANGUL_BASE;
    }
    // Set the first LV, then write all other Hangul syllables as LVT,
    // then overwrite the remaining LV.
    umutablecptrie_set(norm16Trie, Hangul::HANGUL_BASE, lv, errorCode);
    umutablecptrie_setRange(norm16Trie, Hangul::HANGUL_BASE+1, Hangul::HANGUL_END, lvt, errorCode);
    UChar32 c=Hangul::HANGUL_BASE;
    while((c+=Hangul::JAMO_T_COUNT)<=Hangul::HANGUL_END) {
        umutablecptrie_set(norm16Trie, c, lv, errorCode);
    }
    errorCode.assertSuccess();
}